

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void __thiscall TorController::disconnected_cb(TorController *this,TorControlConnection *_conn)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  CNetAddr *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<1U> in_stack_00000018;
  size_t in_stack_00000020;
  timeval time;
  Level in_stack_00000110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  CService *in_stack_ffffffffffffff70;
  CService *in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  undefined1 local_60 [8];
  LogFlags in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CNetAddr::IsValid(in_RDI);
  if (bVar2) {
    RemoveLocal(local_60._8_8_);
  }
  CService::CService((CService *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  CService::operator=(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  CService::~CService((CService *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if ((in_RDI[9].m_addr._union.direct[8] & 1U) != 0) {
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff88,(char *)in_RDI);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff88,(char *)in_RDI);
      in_stack_ffffffffffffff78 = (CService *)((long)&(in_RDI->m_addr)._union + 8);
      logging_function._M_str = (char *)time.tv_sec;
      logging_function._M_len = (size_t)this;
      source_file._M_str = (char *)_conn;
      source_file._M_len = in_stack_00000020;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
                 in_stack_00000110,in_stack_00000018,in_stack_00000120);
    }
    _local_60 = MillisToTimeval((int64_t)in_stack_ffffffffffffff78);
    if (*(long *)&in_RDI[9].m_addr._size != 0) {
      event_add(*(undefined8 *)&in_RDI[9].m_addr._size,local_60);
    }
    in_RDI[9].m_net = (Network)((float)in_RDI[9].m_net * 1.5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TorController::disconnected_cb(TorControlConnection& _conn)
{
    // Stop advertising service when disconnected
    if (service.IsValid())
        RemoveLocal(service);
    service = CService();
    if (!reconnect)
        return;

    LogDebug(BCLog::TOR, "Not connected to Tor control port %s, trying to reconnect\n", m_tor_control_center);

    // Single-shot timer for reconnect. Use exponential backoff.
    struct timeval time = MillisToTimeval(int64_t(reconnect_timeout * 1000.0));
    if (reconnect_ev)
        event_add(reconnect_ev, &time);
    reconnect_timeout *= RECONNECT_TIMEOUT_EXP;
}